

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<137UL,_GF2::MOGrlex<137UL>_>::Geobucket<4UL>::PopLM(Geobucket<4UL> *this,MM<137UL> *lm)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  MOGrlex<137UL> *pMVar3;
  MOGrlex<137UL> *in_RDI;
  MOGrlex<137UL> *o;
  size_t j;
  size_t i;
  int cmp;
  MM<137UL> *in_stack_ffffffffffffffb8;
  MOGrlex<137UL> *in_stack_ffffffffffffffc0;
  size_type local_28;
  size_type local_20;
  
  local_20 = 0xffffffffffffffff;
  local_28 = std::
             vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
             ::size((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                     *)in_RDI);
  this_00 = std::
            vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
            ::operator[]((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                          *)in_RDI,0);
  pMVar3 = GetOrder(this_00);
  do {
    local_28 = local_28 - 1;
    std::
    vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
    ::operator[]((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                  *)in_RDI,local_28);
    bVar1 = MP<137UL,_GF2::MOGrlex<137UL>_>::IsEmpty((MP<137UL,_GF2::MOGrlex<137UL>_> *)0x1afda6);
    if (!bVar1) {
      if (local_20 != 0xffffffffffffffff) {
        in_stack_ffffffffffffffc0 = pMVar3;
        std::
        vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
        ::operator[]((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                      *)in_RDI,local_28);
        LM((MP<137UL,_GF2::MOGrlex<137UL>_> *)in_stack_ffffffffffffffc0);
        iVar2 = MOGrlex<137UL>::Compare
                          (in_RDI,(MM<137UL> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if (iVar2 < 1) {
          if (iVar2 == 0) {
            std::
            vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
            ::operator[]((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                          *)in_RDI,local_20);
            MP<137UL,_GF2::MOGrlex<137UL>_>::PopLM((MP<137UL,_GF2::MOGrlex<137UL>_> *)0x1afe3e);
            std::
            vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
            ::operator[]((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                          *)in_RDI,local_28);
            MP<137UL,_GF2::MOGrlex<137UL>_>::PopLM((MP<137UL,_GF2::MOGrlex<137UL>_> *)0x1afe55);
            local_20 = 0xffffffffffffffff;
            local_28 = std::
                       vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                       ::size((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                               *)in_RDI);
          }
          goto LAB_001afe71;
        }
      }
      std::
      vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
      ::operator[]((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                    *)in_RDI,local_28);
      LM((MP<137UL,_GF2::MOGrlex<137UL>_> *)in_stack_ffffffffffffffc0);
      MM<137UL>::operator=((MM<137UL> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_20 = local_28;
    }
LAB_001afe71:
    if (local_28 == 0) {
      if (local_20 != 0xffffffffffffffff) {
        std::
        vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
        ::operator[]((vector<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                      *)in_RDI,local_20);
        MP<137UL,_GF2::MOGrlex<137UL>_>::PopLM((MP<137UL,_GF2::MOGrlex<137UL>_> *)0x1afe9c);
      }
      return local_20 != 0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

bool PopLM(MM<_n>& lm)
		{
			int cmp;
			size_t i = SIZE_MAX, j = (size_t)_buckets.size();
			const _O& o = _buckets[0].GetOrder();
			do
			{
				// пропускаем пустые корзины
				if (_buckets[--j].IsEmpty())
					continue;
				// новый старший моном?
				if (i == SIZE_MAX || (cmp = o.Compare(_buckets[j].LM(), lm)) > 0)
					lm = _buckets[i = j].LM();
				// одинаковые мономы?
				else if (cmp == 0) 
				{
					// удаляем мономы из корзин и начинаем все сначала
					_buckets[i].PopLM(), _buckets[j].PopLM();
					i = SIZE_MAX, j = (size_t)_buckets.size();
				}
			}
			while (j != 0);
			// моногочлен ненулевой?
			if (i != SIZE_MAX) _buckets[i].PopLM();
			// признак успеха
			return i != SIZE_MAX;
		}